

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataCollection::AppendUnified
          (TupleDataCollection *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          DataChunk *new_chunk,SelectionVector *append_sel,idx_t append_count)

{
  if (append_count == 0xffffffffffffffff) {
    append_count = new_chunk->count;
  }
  if (append_count != 0) {
    if (this->layout->all_constant == false) {
      ComputeHeapSizes(chunk_state,new_chunk,append_sel,append_count);
    }
    Build(this,pin_state,chunk_state,0,append_count);
    Scatter(this,chunk_state,new_chunk,append_sel,append_count);
    return;
  }
  return;
}

Assistant:

void TupleDataCollection::AppendUnified(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                        DataChunk &new_chunk, const SelectionVector &append_sel,
                                        const idx_t append_count) {
	const idx_t actual_append_count = append_count == DConstants::INVALID_INDEX ? new_chunk.size() : append_count;
	if (actual_append_count == 0) {
		return;
	}

	if (!layout.AllConstant()) {
		TupleDataCollection::ComputeHeapSizes(chunk_state, new_chunk, append_sel, actual_append_count);
	}

	Build(pin_state, chunk_state, 0, actual_append_count);
	Scatter(chunk_state, new_chunk, append_sel, actual_append_count);
}